

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall
ON_Font::SetSimulated
          (ON_Font *this,bool bSimulatedWeight,bool bSimulatedStretch,bool bSimulatedStyle,
          bool bSimulatedOther)

{
  byte local_15;
  ON__UINT8 s;
  bool bSimulatedOther_local;
  bool bSimulatedStyle_local;
  bool bSimulatedStretch_local;
  bool bSimulatedWeight_local;
  ON_Font *this_local;
  
  local_15 = 0;
  if (bSimulatedWeight) {
    local_15 = 2;
  }
  if (bSimulatedStretch) {
    local_15 = local_15 | 4;
  }
  if (bSimulatedStyle) {
    local_15 = local_15 | 8;
  }
  if (bSimulatedOther) {
    local_15 = local_15 | 1;
  }
  this->m_simulated = local_15;
  return;
}

Assistant:

void ON_Font::SetSimulated(
  bool bSimulatedWeight,
  bool bSimulatedStretch,
  bool bSimulatedStyle,
  bool bSimulatedOther
)
{
  ON__UINT8 s = 0;
  if (bSimulatedWeight)
    s |= 2;
  if (bSimulatedStretch)
    s |= 4;
  if (bSimulatedStyle)
    s |= 8;
  if (bSimulatedOther)
    s |= 1;
  m_simulated = s;
}